

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar4;
  float fVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  Geometry *pGVar7;
  RTCIntersectArguments *pRVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  byte bVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  ulong unaff_R12;
  size_t mask;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  int local_149c;
  ulong local_1498;
  ulong local_1490;
  NodeRef *local_1488;
  ulong local_1480;
  ulong local_1478;
  ulong local_1470;
  ulong local_1468;
  Ray *local_1460;
  RayQueryContext *local_1458;
  ulong local_1450;
  ulong local_1448;
  Scene *local_1440;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  undefined1 local_12d8 [16];
  undefined1 local_12c8 [16];
  undefined1 local_12b8 [16];
  undefined1 local_12a8 [16];
  undefined1 local_1298 [16];
  undefined1 local_1288 [16];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  float fVar2;
  float fVar3;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    if (0.0 <= ray->tfar) {
      local_1488 = stack + 1;
      aVar6 = (ray->dir).field_0;
      auVar44 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar22._8_4_ = 0x7fffffff;
      auVar22._0_8_ = 0x7fffffff7fffffff;
      auVar22._12_4_ = 0x7fffffff;
      auVar22 = vandps_avx512vl((undefined1  [16])aVar6,auVar22);
      auVar23._8_4_ = 0x219392ef;
      auVar23._0_8_ = 0x219392ef219392ef;
      auVar23._12_4_ = 0x219392ef;
      uVar19 = vcmpps_avx512vl(auVar22,auVar23,1);
      auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar60 = ZEXT1664(auVar22);
      auVar22 = vdivps_avx512vl(auVar22,(undefined1  [16])aVar6);
      auVar23 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar21 = (bool)((byte)uVar19 & 1);
      auVar39._0_4_ = (uint)bVar21 * auVar23._0_4_ | (uint)!bVar21 * auVar22._0_4_;
      bVar21 = (bool)((byte)(uVar19 >> 1) & 1);
      auVar39._4_4_ = (uint)bVar21 * auVar23._4_4_ | (uint)!bVar21 * auVar22._4_4_;
      bVar21 = (bool)((byte)(uVar19 >> 2) & 1);
      auVar39._8_4_ = (uint)bVar21 * auVar23._8_4_ | (uint)!bVar21 * auVar22._8_4_;
      bVar21 = (bool)((byte)(uVar19 >> 3) & 1);
      auVar39._12_4_ = (uint)bVar21 * auVar23._12_4_ | (uint)!bVar21 * auVar22._12_4_;
      auVar24._8_4_ = 0x3f7ffffa;
      auVar24._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar24._12_4_ = 0x3f7ffffa;
      auVar24 = vmulps_avx512vl(auVar39,auVar24);
      auVar25._8_4_ = 0x3f800003;
      auVar25._0_8_ = 0x3f8000033f800003;
      auVar25._12_4_ = 0x3f800003;
      auVar25 = vmulps_avx512vl(auVar39,auVar25);
      auVar45 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar61 = ZEXT3264(auVar45);
      auVar45 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar62 = ZEXT3264(auVar45);
      auVar45 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar63 = ZEXT3264(auVar45);
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar45 = vbroadcastss_avx512vl(auVar24);
      auVar64 = ZEXT3264(auVar45);
      auVar22 = vmovshdup_avx(auVar24);
      auVar45 = vbroadcastsd_avx512vl(auVar22);
      auVar65 = ZEXT3264(auVar45);
      auVar23 = vshufpd_avx(auVar24,auVar24,1);
      auVar48._8_4_ = 2;
      auVar48._0_8_ = 0x200000002;
      auVar48._12_4_ = 2;
      auVar48._16_4_ = 2;
      auVar48._20_4_ = 2;
      auVar48._24_4_ = 2;
      auVar48._28_4_ = 2;
      auVar45 = vpermps_avx512vl(auVar48,ZEXT1632(auVar24));
      auVar46 = vbroadcastss_avx512vl(auVar25);
      auVar47._8_4_ = 1;
      auVar47._0_8_ = 0x100000001;
      auVar47._12_4_ = 1;
      auVar47._16_4_ = 1;
      auVar47._20_4_ = 1;
      auVar47._24_4_ = 1;
      auVar47._28_4_ = 1;
      auVar47 = vpermps_avx512vl(auVar47,ZEXT1632(auVar25));
      auVar48 = vpermps_avx512vl(auVar48,ZEXT1632(auVar25));
      local_1490 = (ulong)(auVar24._0_4_ < 0.0) << 5;
      local_1498 = (ulong)(auVar22._0_4_ < 0.0) << 5 | 0x40;
      local_1478 = (ulong)(auVar23._0_4_ < 0.0) << 5 | 0x80;
      local_1480 = local_1490 ^ 0x20;
      uVar19 = local_1498 ^ 0x20;
      uVar20 = local_1478 ^ 0x20;
      auVar49 = vbroadcastss_avx512vl(auVar44);
      auVar50 = vbroadcastss_avx512vl(ZEXT416((uint)ray->tfar));
      local_1470 = uVar20;
      local_1468 = uVar19;
      do {
        if (local_1488 == stack) {
          return;
        }
        uVar17 = local_1488[-1].ptr;
        local_1488 = local_1488 + -1;
        do {
          if ((uVar17 & 8) == 0) {
            auVar51 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar17 + 0x40 + local_1490),
                                      auVar61._0_32_);
            auVar51 = vmulps_avx512vl(auVar64._0_32_,auVar51);
            auVar52 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar17 + 0x40 + local_1498),
                                      auVar62._0_32_);
            auVar52 = vmulps_avx512vl(auVar65._0_32_,auVar52);
            auVar51 = vmaxps_avx(auVar51,auVar52);
            auVar52 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar17 + 0x40 + local_1478),
                                      auVar63._0_32_);
            auVar52 = vmulps_avx512vl(auVar45,auVar52);
            auVar52 = vmaxps_avx512vl(auVar52,auVar49);
            auVar51 = vmaxps_avx(auVar51,auVar52);
            auVar52 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar17 + 0x40 + local_1480),
                                      auVar61._0_32_);
            auVar52 = vmulps_avx512vl(auVar46,auVar52);
            auVar53 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar17 + 0x40 + uVar19),auVar62._0_32_)
            ;
            auVar53 = vmulps_avx512vl(auVar47,auVar53);
            auVar52 = vminps_avx(auVar52,auVar53);
            auVar53 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar17 + 0x40 + uVar20),auVar63._0_32_)
            ;
            auVar53 = vmulps_avx512vl(auVar48,auVar53);
            auVar53 = vminps_avx512vl(auVar53,auVar50);
            auVar52 = vminps_avx(auVar52,auVar53);
            uVar12 = vcmpps_avx512vl(auVar51,auVar52,2);
            unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),(uint)(byte)uVar12);
          }
          if ((uVar17 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar18 = 4;
            }
            else {
              uVar16 = uVar17 & 0xfffffffffffffff0;
              lVar15 = 0;
              for (uVar17 = unaff_R12; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000)
              {
                lVar15 = lVar15 + 1;
              }
              iVar18 = 0;
              for (uVar14 = unaff_R12 - 1 & unaff_R12; uVar17 = *(ulong *)(uVar16 + lVar15 * 8),
                  uVar14 != 0; uVar14 = uVar14 - 1 & uVar14) {
                local_1488->ptr = uVar17;
                local_1488 = local_1488 + 1;
                lVar15 = 0;
                for (uVar17 = uVar14; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000)
                {
                  lVar15 = lVar15 + 1;
                }
              }
            }
          }
          else {
            iVar18 = 6;
          }
        } while (iVar18 == 0);
        if (iVar18 == 6) {
          iVar18 = 0;
          local_1450 = (ulong)((uint)uVar17 & 0xf) - 8;
          bVar21 = local_1450 != 0;
          if (bVar21) {
            uVar17 = uVar17 & 0xfffffffffffffff0;
            local_1448 = 0;
            do {
              lVar15 = local_1448 * 0xb0;
              uVar4 = *(undefined4 *)&(ray->org).field_0;
              auVar29._4_4_ = uVar4;
              auVar29._0_4_ = uVar4;
              auVar29._8_4_ = uVar4;
              auVar29._12_4_ = uVar4;
              uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar30._4_4_ = uVar4;
              auVar30._0_4_ = uVar4;
              auVar30._8_4_ = uVar4;
              auVar30._12_4_ = uVar4;
              uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar31._4_4_ = uVar4;
              auVar31._0_4_ = uVar4;
              auVar31._8_4_ = uVar4;
              auVar31._12_4_ = uVar4;
              uVar4 = *(undefined4 *)&(ray->dir).field_0;
              auVar55._4_4_ = uVar4;
              auVar55._0_4_ = uVar4;
              auVar55._8_4_ = uVar4;
              auVar55._12_4_ = uVar4;
              uVar4 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
              auVar56._4_4_ = uVar4;
              auVar56._0_4_ = uVar4;
              auVar56._8_4_ = uVar4;
              auVar56._12_4_ = uVar4;
              fVar5 = (ray->dir).field_0.m128[2];
              auVar57._4_4_ = fVar5;
              auVar57._0_4_ = fVar5;
              auVar57._8_4_ = fVar5;
              auVar57._12_4_ = fVar5;
              auVar44 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + lVar15),auVar29);
              auVar22 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x10 + lVar15),auVar30);
              auVar23 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x20 + lVar15),auVar31);
              auVar24 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x30 + lVar15),auVar29);
              auVar26 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar17 + 0x40 + lVar15),auVar30);
              auVar27 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar17 + 0x50 + lVar15),auVar31);
              auVar28 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar17 + 0x60 + lVar15),auVar29);
              auVar29 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar17 + 0x70 + lVar15),auVar30);
              auVar30 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar17 + 0x80 + lVar15),auVar31);
              auVar31 = vsubps_avx512vl(auVar28,auVar44);
              auVar32 = vsubps_avx512vl(auVar29,auVar22);
              auVar33 = vsubps_avx512vl(auVar30,auVar23);
              auVar25 = vsubps_avx(auVar44,auVar24);
              auVar34 = vsubps_avx512vl(auVar22,auVar26);
              auVar35 = vsubps_avx512vl(auVar23,auVar27);
              auVar36 = vsubps_avx512vl(auVar24,auVar28);
              auVar37 = vsubps_avx512vl(auVar26,auVar29);
              auVar38 = vsubps_avx512vl(auVar27,auVar30);
              auVar39 = vaddps_avx512vl(auVar44,auVar28);
              auVar40 = vaddps_avx512vl(auVar22,auVar29);
              auVar41 = vaddps_avx512vl(auVar23,auVar30);
              auVar42 = vmulps_avx512vl(auVar40,auVar33);
              auVar42 = vfmsub231ps_avx512vl(auVar42,auVar32,auVar41);
              auVar41 = vmulps_avx512vl(auVar41,auVar31);
              auVar41 = vfmsub231ps_avx512vl(auVar41,auVar33,auVar39);
              auVar43._0_4_ = auVar32._0_4_ * auVar39._0_4_;
              auVar43._4_4_ = auVar32._4_4_ * auVar39._4_4_;
              auVar43._8_4_ = auVar32._8_4_ * auVar39._8_4_;
              auVar43._12_4_ = auVar32._12_4_ * auVar39._12_4_;
              auVar39 = vfmsub231ps_fma(auVar43,auVar31,auVar40);
              auVar40._0_4_ = fVar5 * auVar39._0_4_;
              auVar40._4_4_ = fVar5 * auVar39._4_4_;
              auVar40._8_4_ = fVar5 * auVar39._8_4_;
              auVar40._12_4_ = fVar5 * auVar39._12_4_;
              auVar39 = vfmadd231ps_avx512vl(auVar40,auVar56,auVar41);
              auVar39 = vfmadd231ps_avx512vl(auVar39,auVar55,auVar42);
              auVar58._0_4_ = auVar24._0_4_ + auVar44._0_4_;
              auVar58._4_4_ = auVar24._4_4_ + auVar44._4_4_;
              auVar58._8_4_ = auVar24._8_4_ + auVar44._8_4_;
              auVar58._12_4_ = auVar24._12_4_ + auVar44._12_4_;
              auVar40 = vaddps_avx512vl(auVar22,auVar26);
              auVar41 = vaddps_avx512vl(auVar23,auVar27);
              auVar42 = vmulps_avx512vl(auVar40,auVar35);
              auVar42 = vfmsub231ps_avx512vl(auVar42,auVar34,auVar41);
              auVar41 = vmulps_avx512vl(auVar41,auVar25);
              auVar41 = vfmsub231ps_avx512vl(auVar41,auVar35,auVar58);
              auVar43 = vmulps_avx512vl(auVar58,auVar34);
              auVar40 = vfmsub231ps_avx512vl(auVar43,auVar25,auVar40);
              auVar59._0_4_ = fVar5 * auVar40._0_4_;
              auVar59._4_4_ = fVar5 * auVar40._4_4_;
              auVar59._8_4_ = fVar5 * auVar40._8_4_;
              auVar59._12_4_ = fVar5 * auVar40._12_4_;
              auVar40 = vfmadd231ps_avx512vl(auVar59,auVar56,auVar41);
              auVar40 = vfmadd231ps_avx512vl(auVar40,auVar55,auVar42);
              auVar24 = vaddps_avx512vl(auVar24,auVar28);
              auVar26 = vaddps_avx512vl(auVar26,auVar29);
              auVar27 = vaddps_avx512vl(auVar27,auVar30);
              auVar28 = vmulps_avx512vl(auVar26,auVar38);
              auVar28 = vfmsub231ps_avx512vl(auVar28,auVar37,auVar27);
              auVar27 = vmulps_avx512vl(auVar27,auVar36);
              auVar27 = vfmsub231ps_avx512vl(auVar27,auVar38,auVar24);
              auVar41._0_4_ = auVar24._0_4_ * auVar37._0_4_;
              auVar41._4_4_ = auVar24._4_4_ * auVar37._4_4_;
              auVar41._8_4_ = auVar24._8_4_ * auVar37._8_4_;
              auVar41._12_4_ = auVar24._12_4_ * auVar37._12_4_;
              auVar24 = vfmsub231ps_avx512vl(auVar41,auVar36,auVar26);
              auVar24 = vmulps_avx512vl(auVar57,auVar24);
              auVar24 = vfmadd231ps_avx512vl(auVar24,auVar56,auVar27);
              auVar24 = vfmadd231ps_avx512vl(auVar24,auVar55,auVar28);
              auVar42._0_4_ = auVar40._0_4_ + auVar39._0_4_;
              auVar42._4_4_ = auVar40._4_4_ + auVar39._4_4_;
              auVar42._8_4_ = auVar40._8_4_ + auVar39._8_4_;
              auVar42._12_4_ = auVar40._12_4_ + auVar39._12_4_;
              auVar29 = vaddps_avx512vl(auVar24,auVar42);
              auVar26._8_4_ = 0x7fffffff;
              auVar26._0_8_ = 0x7fffffff7fffffff;
              auVar26._12_4_ = 0x7fffffff;
              auVar26 = vandps_avx512vl(auVar29,auVar26);
              auVar27._8_4_ = 0x34000000;
              auVar27._0_8_ = 0x3400000034000000;
              auVar27._12_4_ = 0x34000000;
              auVar27 = vmulps_avx512vl(auVar26,auVar27);
              auVar28 = vminps_avx512vl(auVar39,auVar40);
              auVar30 = vminps_avx512vl(auVar28,auVar24);
              auVar28._8_4_ = 0x80000000;
              auVar28._0_8_ = 0x8000000080000000;
              auVar28._12_4_ = 0x80000000;
              auVar28 = vxorps_avx512vl(auVar27,auVar28);
              uVar12 = vcmpps_avx512vl(auVar30,auVar28,5);
              auVar28 = vmaxps_avx512vl(auVar39,auVar40);
              auVar24 = vmaxps_avx512vl(auVar28,auVar24);
              uVar10 = vcmpps_avx512vl(auVar24,auVar27,2);
              bVar13 = ((byte)uVar12 | (byte)uVar10) & 0xf;
              if (bVar13 != 0) {
                auVar24 = vmulps_avx512vl(auVar34,auVar33);
                auVar27 = vmulps_avx512vl(auVar35,auVar31);
                auVar28 = vmulps_avx512vl(auVar25,auVar32);
                auVar30 = vmulps_avx512vl(auVar35,auVar37);
                auVar41 = vmulps_avx512vl(auVar25,auVar38);
                auVar42 = vmulps_avx512vl(auVar34,auVar36);
                auVar32 = vfmsub213ps_avx512vl(auVar32,auVar35,auVar24);
                auVar33 = vfmsub213ps_avx512vl(auVar33,auVar25,auVar27);
                auVar31 = vfmsub213ps_avx512vl(auVar31,auVar34,auVar28);
                auVar34 = vfmsub213ps_avx512vl(auVar38,auVar34,auVar30);
                auVar35 = vfmsub213ps_avx512vl(auVar36,auVar35,auVar41);
                auVar25 = vfmsub213ps_avx512vl(auVar37,auVar25,auVar42);
                auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar24 = vandps_avx512vl(auVar24,auVar36);
                auVar30 = vandps_avx512vl(auVar30,auVar36);
                uVar19 = vcmpps_avx512vl(auVar24,auVar30,1);
                auVar24 = vandps_avx512vl(auVar27,auVar36);
                auVar27 = vandps_avx512vl(auVar41,auVar36);
                uVar20 = vcmpps_avx512vl(auVar24,auVar27,1);
                auVar24 = vandps_avx512vl(auVar28,auVar36);
                auVar27 = vandps_avx512vl(auVar42,auVar36);
                uVar16 = vcmpps_avx512vl(auVar24,auVar27,1);
                bVar9 = (bool)((byte)uVar19 & 1);
                local_12a8._0_4_ = (uint)bVar9 * auVar32._0_4_ | (uint)!bVar9 * auVar34._0_4_;
                bVar9 = (bool)((byte)(uVar19 >> 1) & 1);
                local_12a8._4_4_ = (uint)bVar9 * auVar32._4_4_ | (uint)!bVar9 * auVar34._4_4_;
                bVar9 = (bool)((byte)(uVar19 >> 2) & 1);
                local_12a8._8_4_ = (uint)bVar9 * auVar32._8_4_ | (uint)!bVar9 * auVar34._8_4_;
                bVar9 = (bool)((byte)(uVar19 >> 3) & 1);
                local_12a8._12_4_ = (uint)bVar9 * auVar32._12_4_ | (uint)!bVar9 * auVar34._12_4_;
                bVar9 = (bool)((byte)uVar20 & 1);
                local_1298._0_4_ = (uint)bVar9 * auVar33._0_4_ | (uint)!bVar9 * auVar35._0_4_;
                bVar9 = (bool)((byte)(uVar20 >> 1) & 1);
                local_1298._4_4_ = (uint)bVar9 * auVar33._4_4_ | (uint)!bVar9 * auVar35._4_4_;
                bVar9 = (bool)((byte)(uVar20 >> 2) & 1);
                local_1298._8_4_ = (uint)bVar9 * auVar33._8_4_ | (uint)!bVar9 * auVar35._8_4_;
                bVar9 = (bool)((byte)(uVar20 >> 3) & 1);
                local_1298._12_4_ = (uint)bVar9 * auVar33._12_4_ | (uint)!bVar9 * auVar35._12_4_;
                bVar9 = (bool)((byte)uVar16 & 1);
                local_1288._0_4_ =
                     (float)((uint)bVar9 * auVar31._0_4_ | (uint)!bVar9 * auVar25._0_4_);
                bVar9 = (bool)((byte)(uVar16 >> 1) & 1);
                local_1288._4_4_ =
                     (float)((uint)bVar9 * auVar31._4_4_ | (uint)!bVar9 * auVar25._4_4_);
                bVar9 = (bool)((byte)(uVar16 >> 2) & 1);
                local_1288._8_4_ =
                     (float)((uint)bVar9 * auVar31._8_4_ | (uint)!bVar9 * auVar25._8_4_);
                bVar9 = (bool)((byte)(uVar16 >> 3) & 1);
                local_1288._12_4_ =
                     (float)((uint)bVar9 * auVar31._12_4_ | (uint)!bVar9 * auVar25._12_4_);
                auVar36._0_4_ = fVar5 * local_1288._0_4_;
                auVar36._4_4_ = fVar5 * local_1288._4_4_;
                auVar36._8_4_ = fVar5 * local_1288._8_4_;
                auVar36._12_4_ = fVar5 * local_1288._12_4_;
                auVar24 = vfmadd213ps_fma(auVar56,local_1298,auVar36);
                auVar24 = vfmadd213ps_fma(auVar55,local_12a8,auVar24);
                auVar35._0_4_ = auVar24._0_4_ + auVar24._0_4_;
                auVar35._4_4_ = auVar24._4_4_ + auVar24._4_4_;
                auVar35._8_4_ = auVar24._8_4_ + auVar24._8_4_;
                auVar35._12_4_ = auVar24._12_4_ + auVar24._12_4_;
                auVar34._0_4_ = auVar23._0_4_ * local_1288._0_4_;
                auVar34._4_4_ = auVar23._4_4_ * local_1288._4_4_;
                auVar34._8_4_ = auVar23._8_4_ * local_1288._8_4_;
                auVar34._12_4_ = auVar23._12_4_ * local_1288._12_4_;
                auVar22 = vfmadd213ps_fma(auVar22,local_1298,auVar34);
                auVar22 = vfmadd213ps_fma(auVar44,local_12a8,auVar22);
                auVar44 = vrcp14ps_avx512vl(auVar35);
                auVar24 = auVar60._0_16_;
                auVar23 = vfnmadd213ps_avx512vl(auVar44,auVar35,auVar24);
                auVar44 = vfmadd132ps_fma(auVar23,auVar44,auVar44);
                local_12b8._0_4_ = (auVar22._0_4_ + auVar22._0_4_) * auVar44._0_4_;
                local_12b8._4_4_ = (auVar22._4_4_ + auVar22._4_4_) * auVar44._4_4_;
                local_12b8._8_4_ = (auVar22._8_4_ + auVar22._8_4_) * auVar44._8_4_;
                local_12b8._12_4_ = (auVar22._12_4_ + auVar22._12_4_) * auVar44._12_4_;
                uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar44._4_4_ = uVar4;
                auVar44._0_4_ = uVar4;
                auVar44._8_4_ = uVar4;
                auVar44._12_4_ = uVar4;
                uVar12 = vcmpps_avx512vl(local_12b8,auVar44,0xd);
                auVar32._8_4_ = 0x80000000;
                auVar32._0_8_ = 0x8000000080000000;
                auVar32._12_4_ = 0x80000000;
                auVar44 = vxorps_avx512vl(auVar35,auVar32);
                fVar5 = ray->tfar;
                auVar33._4_4_ = fVar5;
                auVar33._0_4_ = fVar5;
                auVar33._8_4_ = fVar5;
                auVar33._12_4_ = fVar5;
                uVar10 = vcmpps_avx512vl(local_12b8,auVar33,2);
                uVar11 = vcmpps_avx512vl(auVar35,auVar44,4);
                bVar13 = (byte)uVar12 & (byte)uVar10 & (byte)uVar11 & bVar13;
                if (bVar13 != 0) {
                  auVar37._8_4_ = 0x219392ef;
                  auVar37._0_8_ = 0x219392ef219392ef;
                  auVar37._12_4_ = 0x219392ef;
                  uVar19 = vcmpps_avx512vl(auVar26,auVar37,5);
                  auVar44 = vrcp14ps_avx512vl(auVar29);
                  auVar22 = vfnmadd213ps_avx512vl(auVar29,auVar44,auVar24);
                  auVar44 = vfmadd132ps_avx512vl(auVar22,auVar44,auVar44);
                  fVar5 = (float)((uint)((byte)uVar19 & 1) * auVar44._0_4_);
                  fVar1 = (float)((uint)((byte)(uVar19 >> 1) & 1) * auVar44._4_4_);
                  fVar2 = (float)((uint)((byte)(uVar19 >> 2) & 1) * auVar44._8_4_);
                  fVar3 = (float)((uint)((byte)(uVar19 >> 3) & 1) * auVar44._12_4_);
                  auVar38._0_4_ = fVar5 * auVar39._0_4_;
                  auVar38._4_4_ = fVar1 * auVar39._4_4_;
                  auVar38._8_4_ = fVar2 * auVar39._8_4_;
                  auVar38._12_4_ = fVar3 * auVar39._12_4_;
                  local_12d8 = vminps_avx512vl(auVar38,auVar24);
                  local_1440 = context->scene;
                  auVar54._0_4_ = fVar5 * auVar40._0_4_;
                  auVar54._4_4_ = fVar1 * auVar40._4_4_;
                  auVar54._8_4_ = fVar2 * auVar40._8_4_;
                  auVar54._12_4_ = fVar3 * auVar40._12_4_;
                  local_12c8 = vminps_avx512vl(auVar54,auVar24);
                  uVar19 = (ulong)bVar13;
                  do {
                    uVar20 = 0;
                    for (uVar16 = uVar19; (uVar16 & 1) == 0;
                        uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                      uVar20 = uVar20 + 1;
                    }
                    h.geomID = *(uint *)(lVar15 + uVar17 + 0x90 + uVar20 * 4);
                    pGVar7 = (local_1440->geometries).items[h.geomID].ptr;
                    if ((pGVar7->mask & ray->mask) == 0) {
                      uVar19 = uVar19 ^ 1L << (uVar20 & 0x3f);
                      bVar9 = true;
                    }
                    else {
                      pRVar8 = context->args;
                      if ((pRVar8->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar9 = false;
                      }
                      else {
                        uVar16 = (ulong)(uint)((int)uVar20 * 4);
                        h.u = *(float *)(local_12d8 + uVar16);
                        h.v = *(float *)(local_12c8 + uVar16);
                        args.context = context->user;
                        h.primID = *(uint *)(lVar15 + uVar17 + 0xa0 + uVar16);
                        h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_12a8 + uVar16);
                        h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_1298 + uVar16);
                        h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_1288 + uVar16);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        fVar5 = ray->tfar;
                        ray->tfar = *(float *)(local_12b8 + uVar16);
                        local_149c = -1;
                        args.valid = &local_149c;
                        args.geometryUserPtr = pGVar7->userPtr;
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        local_11f8 = auVar61._0_32_;
                        local_1218 = auVar62._0_32_;
                        local_1238 = auVar63._0_32_;
                        local_1258 = auVar64._0_32_;
                        local_1278 = auVar65._0_32_;
                        args.ray = (RTCRayN *)ray;
                        if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00722a3e:
                          if (pRVar8->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar8->filter)(&args);
                              auVar65 = ZEXT3264(local_1278);
                              auVar64 = ZEXT3264(local_1258);
                              auVar63 = ZEXT3264(local_1238);
                              auVar62 = ZEXT3264(local_1218);
                              auVar61 = ZEXT3264(local_11f8);
                              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar60 = ZEXT1664(auVar44);
                            }
                            if (*args.valid == 0) goto LAB_00722af6;
                          }
                          bVar9 = false;
                        }
                        else {
                          local_1460 = ray;
                          local_1458 = context;
                          (*pGVar7->occlusionFilterN)(&args);
                          auVar65 = ZEXT3264(local_1278);
                          auVar64 = ZEXT3264(local_1258);
                          auVar63 = ZEXT3264(local_1238);
                          auVar62 = ZEXT3264(local_1218);
                          auVar61 = ZEXT3264(local_11f8);
                          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar60 = ZEXT1664(auVar44);
                          context = local_1458;
                          ray = local_1460;
                          if (*args.valid != 0) goto LAB_00722a3e;
LAB_00722af6:
                          ray->tfar = fVar5;
                          uVar19 = uVar19 ^ 1L << (uVar20 & 0x3f);
                          bVar9 = true;
                        }
                      }
                    }
                    iVar18 = 0;
                    if (!bVar9) {
                      uVar19 = local_1468;
                      uVar20 = local_1470;
                      if (bVar21) {
                        ray->tfar = -INFINITY;
                        iVar18 = 3;
                      }
                      goto LAB_00722b58;
                    }
                  } while (uVar19 != 0);
                }
              }
              iVar18 = 0;
              local_1448 = local_1448 + 1;
              bVar21 = local_1448 < local_1450;
              uVar19 = local_1468;
              uVar20 = local_1470;
            } while (local_1448 != local_1450);
          }
        }
LAB_00722b58:
      } while (iVar18 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }